

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geodesic.cpp
# Opt level: O1

void Geodesic::splitOnCommonEdge
               (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *t1_edges,
               vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *t2_edges,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *reference_leaf_num_map,vector<PhyloTree,_std::allocator<PhyloTree>_> *destination_a,
               vector<PhyloTree,_std::allocator<PhyloTree>_> *destination_b)

{
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this;
  pointer pPVar1;
  pointer pPVar2;
  pointer pPVar3;
  pointer pPVar4;
  PhyloTreeEdge *pPVar5;
  bool bVar6;
  pointer pPVar7;
  pointer extraout_RAX;
  long lVar8;
  long lVar9;
  size_type __n;
  PhyloTreeEdge *pPVar10;
  long lVar11;
  size_t index;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *__range1_1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *__range1;
  size_type __n_00;
  size_t i;
  long lVar12;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> edgesB2;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> edgesB1;
  PhyloTreeEdge e;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> edgesA2;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> edgesA1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  leaf2NumMapB;
  string leaf_label;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  leaf2NumMapA;
  PhyloTreeEdge commonEdge;
  size_t local_1d8;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_198;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_178;
  PhyloTreeEdge local_160;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_118;
  ulong local_100;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  value_type local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  PhyloTreeEdge local_78;
  undefined7 extraout_var;
  
  pPVar1 = (t1_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pPVar2 = (t1_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pPVar3 = (t2_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pPVar4 = (t2_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)pPVar2 - (long)pPVar1 == 0 || (long)pPVar4 - (long)pPVar3 == 0) {
    return;
  }
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  PhyloTreeEdge::PhyloTreeEdge(&local_78);
  __n_00 = ((long)pPVar2 - (long)pPVar1 >> 3) * -0x71c71c71c71c71c7;
  __n = ((long)pPVar4 - (long)pPVar3 >> 3) * -0x71c71c71c71c71c7;
  PhyloTree::getFirstCommonEdge
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_160,
             t1_edges,t2_edges);
  this = &local_160.super_Bipartition.partition;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&local_78.super_Bipartition.partition.m_bits,&this->m_bits);
  local_78.super_Bipartition.partition.m_num_bits = local_160.super_Bipartition.partition.m_num_bits
  ;
  local_78.length = local_160.length;
  local_78.originalEdge.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_160.originalEdge.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_78.originalEdge.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &local_160.originalEdge.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_78.originalID = local_160.originalID;
  local_160.super_Bipartition._vptr_Bipartition = (_func_int **)&PTR_toString_abi_cxx11__00140b00;
  if (local_160.originalEdge.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_160.originalEdge.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_160.super_Bipartition._vptr_Bipartition = (_func_int **)&PTR_toString_abi_cxx11__001409d0;
  bVar6 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_check_invariants
                    (this);
  if (bVar6) {
    if (local_160.super_Bipartition.partition.m_bits.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_160.super_Bipartition.partition.m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_118.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_178.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_178.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_198.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_198.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_198.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::reserve(&local_f8,__n_00);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::reserve(&local_118,__n);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::reserve(&local_178,__n_00);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::reserve(&local_198,__n);
    pPVar10 = (t1_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pPVar5 = (t1_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pPVar10 != pPVar5) {
      do {
        PhyloTreeEdge::PhyloTreeEdge(&local_160,pPVar10);
        Bipartition::clear(&local_160.super_Bipartition);
        std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::push_back(&local_f8,&local_160);
        std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::push_back(&local_178,&local_160)
        ;
        local_160.super_Bipartition._vptr_Bipartition =
             (_func_int **)&PTR_toString_abi_cxx11__00140b00;
        if (local_160.originalEdge.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_160.originalEdge.
                     super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        local_160.super_Bipartition._vptr_Bipartition =
             (_func_int **)&PTR_toString_abi_cxx11__001409d0;
        bVar6 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                m_check_invariants(&local_160.super_Bipartition.partition);
        if (!bVar6) goto LAB_0011bb00;
        if (local_160.super_Bipartition.partition.m_bits.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_160.super_Bipartition.partition.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        pPVar10 = pPVar10 + 1;
      } while (pPVar10 != pPVar5);
    }
    pPVar10 = (t2_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pPVar5 = (t2_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pPVar10 != pPVar5) {
      do {
        PhyloTreeEdge::PhyloTreeEdge(&local_160,pPVar10);
        Bipartition::clear(&local_160.super_Bipartition);
        std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::push_back(&local_118,&local_160)
        ;
        std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::push_back(&local_198,&local_160)
        ;
        local_160.super_Bipartition._vptr_Bipartition =
             (_func_int **)&PTR_toString_abi_cxx11__00140b00;
        if (local_160.originalEdge.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_160.originalEdge.
                     super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        local_160.super_Bipartition._vptr_Bipartition =
             (_func_int **)&PTR_toString_abi_cxx11__001409d0;
        bVar6 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                m_check_invariants(&local_160.super_Bipartition.partition);
        if (!bVar6) goto LAB_0011bb00;
        if (local_160.super_Bipartition.partition.m_bits.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_160.super_Bipartition.partition.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        pPVar10 = pPVar10 + 1;
      } while (pPVar10 != pPVar5);
    }
    if ((reference_leaf_num_map->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish !=
        (reference_leaf_num_map->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      lVar8 = __n_00 + (__n_00 == 0);
      lVar9 = __n + (__n == 0);
      i = 0;
      index = 0;
      local_1d8 = 0;
      local_100 = 0;
      do {
        std::__cxx11::string::_M_assign((string *)&local_b8);
        bVar6 = Bipartition::contains(&local_78.super_Bipartition,i);
        if (bVar6) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_98,&local_b8);
          if ((local_100 & 1) == 0) {
            local_160.super_Bipartition._vptr_Bipartition =
                 (_func_int **)
                 ((long)&local_160.super_Bipartition.partition.m_bits.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl +
                 8);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_160,local_b8._M_dataplus._M_p,
                       local_b8._M_dataplus._M_p + local_b8._M_string_length);
            std::__cxx11::string::append((char *)&local_160);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_160);
            if (local_160.super_Bipartition._vptr_Bipartition !=
                (_func_int **)
                ((long)&local_160.super_Bipartition.partition.m_bits.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl +
                8U)) {
              operator_delete(local_160.super_Bipartition._vptr_Bipartition);
            }
            if (pPVar2 != pPVar1) {
              lVar11 = 0;
              lVar12 = lVar8;
              do {
                bVar6 = Bipartition::properlyContains
                                  ((Bipartition *)
                                   ((long)&(((t1_edges->
                                             super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->
                                           super_Bipartition)._vptr_Bipartition + lVar11),
                                   &local_78.super_Bipartition);
                if (bVar6) {
                  Bipartition::addOne((Bipartition *)
                                      ((long)&((local_178.
                                                super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              super_Bipartition)._vptr_Bipartition + lVar11),index);
                }
                lVar11 = lVar11 + 0x48;
                lVar12 = lVar12 + -1;
              } while (lVar12 != 0);
            }
            pPVar7 = pPVar4;
            if (pPVar4 != pPVar3) {
              lVar11 = 0;
              lVar12 = lVar9;
              do {
                bVar6 = Bipartition::properlyContains
                                  ((Bipartition *)
                                   ((long)&(((t2_edges->
                                             super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->
                                           super_Bipartition)._vptr_Bipartition + lVar11),
                                   &local_78.super_Bipartition);
                pPVar7 = (pointer)CONCAT71(extraout_var,bVar6);
                if (bVar6) {
                  Bipartition::addOne((Bipartition *)
                                      ((long)&((local_198.
                                                super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              super_Bipartition)._vptr_Bipartition + lVar11),index);
                  pPVar7 = extraout_RAX;
                }
                lVar11 = lVar11 + 0x48;
                lVar12 = lVar12 + -1;
              } while (lVar12 != 0);
            }
            index = index + 1;
            local_100 = CONCAT71((int7)((ulong)pPVar7 >> 8),1);
          }
          if (pPVar2 != pPVar1) {
            lVar11 = 0;
            lVar12 = lVar8;
            do {
              bVar6 = Bipartition::properlyContains
                                (&local_78.super_Bipartition,
                                 (Bipartition *)
                                 ((long)&(((t1_edges->
                                           super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->
                                         super_Bipartition)._vptr_Bipartition + lVar11));
              if ((bVar6) &&
                 (bVar6 = Bipartition::contains
                                    ((Bipartition *)
                                     ((long)&(((t1_edges->
                                               super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->
                                             super_Bipartition)._vptr_Bipartition + lVar11),i),
                 bVar6)) {
                Bipartition::addOne((Bipartition *)
                                    ((long)&((local_f8.
                                              super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super_Bipartition)._vptr_Bipartition + lVar11),local_1d8
                                   );
              }
              lVar11 = lVar11 + 0x48;
              lVar12 = lVar12 + -1;
            } while (lVar12 != 0);
          }
          if (pPVar4 != pPVar3) {
            lVar11 = 0;
            lVar12 = lVar9;
            do {
              bVar6 = Bipartition::properlyContains
                                (&local_78.super_Bipartition,
                                 (Bipartition *)
                                 ((long)&(((t2_edges->
                                           super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->
                                         super_Bipartition)._vptr_Bipartition + lVar11));
              if ((bVar6) &&
                 (bVar6 = Bipartition::contains
                                    ((Bipartition *)
                                     ((long)&(((t2_edges->
                                               super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->
                                             super_Bipartition)._vptr_Bipartition + lVar11),i),
                 bVar6)) {
                Bipartition::addOne((Bipartition *)
                                    ((long)&((local_118.
                                              super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super_Bipartition)._vptr_Bipartition + lVar11),local_1d8
                                   );
              }
              lVar11 = lVar11 + 0x48;
              lVar12 = lVar12 + -1;
            } while (lVar12 != 0);
          }
          local_1d8 = local_1d8 + 1;
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_d8,&local_b8);
          if (pPVar2 != pPVar1) {
            lVar11 = 0;
            lVar12 = lVar8;
            do {
              bVar6 = Bipartition::contains
                                ((Bipartition *)
                                 ((long)&(((t1_edges->
                                           super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->
                                         super_Bipartition)._vptr_Bipartition + lVar11),i);
              if (bVar6) {
                Bipartition::addOne((Bipartition *)
                                    ((long)&((local_178.
                                              super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super_Bipartition)._vptr_Bipartition + lVar11),index);
              }
              lVar11 = lVar11 + 0x48;
              lVar12 = lVar12 + -1;
            } while (lVar12 != 0);
          }
          if (pPVar4 != pPVar3) {
            lVar11 = 0;
            lVar12 = lVar9;
            do {
              bVar6 = Bipartition::contains
                                ((Bipartition *)
                                 ((long)&(((t2_edges->
                                           super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->
                                         super_Bipartition)._vptr_Bipartition + lVar11),i);
              if (bVar6) {
                Bipartition::addOne((Bipartition *)
                                    ((long)&((local_198.
                                              super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super_Bipartition)._vptr_Bipartition + lVar11),index);
              }
              lVar11 = lVar11 + 0x48;
              lVar12 = lVar12 + -1;
            } while (lVar12 != 0);
          }
          index = index + 1;
        }
        i = i + 1;
      } while (i < (ulong)((long)(reference_leaf_num_map->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(reference_leaf_num_map->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    deleteEmptyEdges(&local_f8);
    deleteEmptyEdges(&local_118);
    splitOnCommonEdge(&local_f8,&local_118,&local_98,destination_a,destination_b);
    deleteEmptyEdges(&local_178);
    deleteEmptyEdges(&local_198);
    splitOnCommonEdge(&local_178,&local_198,&local_d8,destination_a,destination_b);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_198);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_178);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_118);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_98);
    local_78.super_Bipartition._vptr_Bipartition = (_func_int **)&PTR_toString_abi_cxx11__00140b00;
    if (local_78.originalEdge.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.originalEdge.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_78.super_Bipartition._vptr_Bipartition = (_func_int **)&PTR_toString_abi_cxx11__001409d0;
    bVar6 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_check_invariants
                      (&local_78.super_Bipartition.partition);
    if (bVar6) {
      if (local_78.super_Bipartition.partition.m_bits.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super_Bipartition.partition.m_bits.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
        return;
      }
      operator_delete(local_b8._M_dataplus._M_p);
      return;
    }
  }
LAB_0011bb00:
  __assert_fail("m_check_invariants()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                ,0x279,
                "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
               );
}

Assistant:

void Geodesic::splitOnCommonEdge(vector<PhyloTreeEdge> &t1_edges, vector<PhyloTreeEdge> &t2_edges,
        vector<string> &reference_leaf_num_map, vector<PhyloTree> &destination_a, vector<PhyloTree> &destination_b) {
    size_t numEdges1 = t1_edges.size(); // number of edges in tree 1
    size_t numEdges2 = t2_edges.size(); /// number of edges in tree 2
    if (numEdges1 == 0 || numEdges2 == 0) {
        return;
    }
    string leaf_label;
    // look for common edges
    PhyloTreeEdge commonEdge;
    try {
        commonEdge = PhyloTree::getFirstCommonEdge(t1_edges, t2_edges);
    }
    catch (edge_not_found_exception &err) {
        destination_a.reserve(destination_a.size() + numEdges1);
        destination_b.reserve(destination_b.size() + numEdges2);
        destination_a.emplace_back(t1_edges, reference_leaf_num_map);
        destination_b.emplace_back(t2_edges, reference_leaf_num_map);
        return;
    }

    // A will be the tree with leaves corresponding to 1's in commonEdge
    vector<string> leaf2NumMapA;
    vector<string> leaf2NumMapB;

    vector<PhyloTreeEdge> edgesA1;
    vector<PhyloTreeEdge> edgesA2;
    vector<PhyloTreeEdge> edgesB1;
    vector<PhyloTreeEdge> edgesB2;

    edgesA1.reserve(numEdges1);
    edgesA2.reserve(numEdges2);
    edgesB1.reserve(numEdges1);
    edgesB2.reserve(numEdges2);

    for (PhyloTreeEdge e : t1_edges) { // have to copy e <= DO NOT MAKE e A REFERENCE
        e.clear();
        edgesA1.push_back(e);
        edgesB1.push_back(e);
    }

    for (PhyloTreeEdge e : t2_edges) { // as above
        e.clear();
        edgesA2.push_back(e);
        edgesB2.push_back(e);
    }

    bool aLeavesAdded = false;  // if we have added a leaf in B representing the A tree
    size_t indexAleaves = 0;  // the index we are at in  the vectors holding the leaves in the A and B subtrees
    size_t indexBleaves = 0;

    // step through the leaves represented in commonEdge
    // (there should be two more leaves than edges)
    for (size_t i = 0; i < reference_leaf_num_map.size(); i++) {
        leaf_label = reference_leaf_num_map[i];
        if (commonEdge.contains(i)) {
            // commonEdge contains leaf i
            leaf2NumMapA.push_back(leaf_label);

            // these leaves must be added as a group to the B trees
            if (!aLeavesAdded) {
                leaf2NumMapB.push_back(leaf_label + "*");    // add a one of the leaves of the A tree to represent all the A trees leaves
                for (size_t j = 0; j < numEdges1; j++) {
                    if (t1_edges[j].properlyContains(commonEdge)) {
                        edgesB1[j].addOne(indexBleaves);
                    }
                }
                for (size_t j = 0; j < numEdges2; j++) {
                    if (t2_edges[j].properlyContains(commonEdge)) {
                        edgesB2[j].addOne(indexBleaves);
                    }
                }
                indexBleaves++;
                aLeavesAdded = true;
            }
            // add the column corresponding to this leaf to the A edges vector (for the corresponding trees)
            // XXX: problem: might be adding edges which contain leaves in A but also
            for (size_t j = 0; j < numEdges1; j++) {
                if (commonEdge.properlyContains(t1_edges[j]) && t1_edges[j].contains(i)) {
                    edgesA1[j].addOne(indexAleaves);
                }
            }
            for (size_t j = 0; j < numEdges2; j++) {
                if (commonEdge.properlyContains(t2_edges[j]) && t2_edges[j].contains(i)) {
                    edgesA2[j].addOne(indexAleaves);
                }
            }
            indexAleaves++;
        } else {
            // commonEdge does not contain leaf i
            leaf2NumMapB.push_back(leaf_label);
            for (int j = 0; j < numEdges1; j++) {
                if (t1_edges[j].contains(i)) {
                    edgesB1[j].addOne(indexBleaves);
                }
            }
            for (int j = 0; j < numEdges2; j++) {
                if (t2_edges[j].contains(i)) {
                    edgesB2[j].addOne(indexBleaves);
                }
            }
            indexBleaves++;
        }
    }

    deleteEmptyEdges(edgesA1);
    deleteEmptyEdges(edgesA2);
    splitOnCommonEdge(edgesA1, edgesA2, leaf2NumMapA, destination_a, destination_b);

    deleteEmptyEdges(edgesB1);
    deleteEmptyEdges(edgesB2);
    splitOnCommonEdge(edgesB1, edgesB2, leaf2NumMapB, destination_a, destination_b);
}